

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isTrilinearRangeValid
               (LookupPrecision *prec,ColorQuad *quad0,ColorQuad *quad1,Vec2 *xBounds,Vec2 *yBounds,
               Vec2 *zBounds,float searchStep,Vec4 *result)

{
  bool bVar1;
  float fVar2;
  Vector<float,_4> local_1b4;
  Vector<float,_4> local_1a4;
  Vector<float,_4> local_194;
  Vector<float,_4> local_184;
  Vector<float,_4> local_174;
  Vector<float,_4> local_164;
  Vector<float,_4> local_154;
  Vector<float,_4> local_144;
  Vector<float,_4> local_134;
  Vector<float,_4> local_124;
  undefined1 local_114 [8];
  Vec4 c1;
  Vector<float,_4> local_f4;
  Vector<float,_4> local_e4;
  Vector<float,_4> local_d4;
  Vector<float,_4> local_c4;
  Vector<float,_4> local_b4;
  Vector<float,_4> local_a4;
  Vector<float,_4> local_94;
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  undefined1 local_64 [8];
  Vec4 c0;
  float b;
  float a;
  float y;
  float x;
  float searchStep_local;
  Vec2 *zBounds_local;
  Vec2 *yBounds_local;
  Vec2 *xBounds_local;
  ColorQuad *quad1_local;
  ColorQuad *quad0_local;
  LookupPrecision *prec_local;
  
  bVar1 = isInColorBounds(prec,quad0,quad1,result);
  if (bVar1) {
    for (a = Vector<float,_2>::x(xBounds); fVar2 = Vector<float,_2>::y(xBounds),
        a < fVar2 + searchStep; a = searchStep + a) {
      for (b = Vector<float,_2>::x(yBounds); fVar2 = Vector<float,_2>::y(yBounds),
          b < fVar2 + searchStep; b = searchStep + b) {
        fVar2 = Vector<float,_2>::y(xBounds);
        c0.m_data[3] = de::min<float>(a,fVar2);
        fVar2 = Vector<float,_2>::y(yBounds);
        c0.m_data[2] = de::min<float>(b,fVar2);
        operator*((tcu *)&local_a4,&quad0->p00,1.0 - c0.m_data[3]);
        operator*((tcu *)&local_94,&local_a4,1.0 - c0.m_data[2]);
        operator*((tcu *)&local_c4,&quad0->p10,c0.m_data[3]);
        operator*((tcu *)&local_b4,&local_c4,1.0 - c0.m_data[2]);
        operator+((tcu *)&local_84,&local_94,&local_b4);
        operator*((tcu *)&local_e4,&quad0->p01,1.0 - c0.m_data[3]);
        operator*((tcu *)&local_d4,&local_e4,c0.m_data[2]);
        operator+((tcu *)&local_74,&local_84,&local_d4);
        operator*((tcu *)(c1.m_data + 2),&quad0->p11,c0.m_data[3]);
        operator*((tcu *)&local_f4,(Vector<float,_4> *)(c1.m_data + 2),c0.m_data[2]);
        operator+((tcu *)local_64,&local_74,&local_f4);
        operator*((tcu *)&local_154,&quad1->p00,1.0 - c0.m_data[3]);
        operator*((tcu *)&local_144,&local_154,1.0 - c0.m_data[2]);
        operator*((tcu *)&local_174,&quad1->p10,c0.m_data[3]);
        operator*((tcu *)&local_164,&local_174,1.0 - c0.m_data[2]);
        operator+((tcu *)&local_134,&local_144,&local_164);
        operator*((tcu *)&local_194,&quad1->p01,1.0 - c0.m_data[3]);
        operator*((tcu *)&local_184,&local_194,c0.m_data[2]);
        operator+((tcu *)&local_124,&local_134,&local_184);
        operator*((tcu *)&local_1b4,&quad1->p11,c0.m_data[3]);
        operator*((tcu *)&local_1a4,&local_1b4,c0.m_data[2]);
        operator+((tcu *)local_114,&local_124,&local_1a4);
        bVar1 = isLinearRangeValid(prec,(Vec4 *)local_64,(Vec4 *)local_114,zBounds,result);
        if (bVar1) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool isTrilinearRangeValid (const LookupPrecision&	prec,
								   const ColorQuad&			quad0,
								   const ColorQuad&			quad1,
								   const Vec2&				xBounds,
								   const Vec2&				yBounds,
								   const Vec2&				zBounds,
								   const float				searchStep,
								   const Vec4&				result)
{
	DE_ASSERT(xBounds.x() <= xBounds.y());
	DE_ASSERT(yBounds.x() <= yBounds.y());
	DE_ASSERT(zBounds.x() <= zBounds.y());
	DE_ASSERT(xBounds.x() + searchStep > xBounds.x()); // step is not effectively 0
	DE_ASSERT(xBounds.y() + searchStep > xBounds.y());
	DE_ASSERT(yBounds.x() + searchStep > yBounds.x());
	DE_ASSERT(yBounds.y() + searchStep > yBounds.y());

	if (!isInColorBounds(prec, quad0, quad1, result))
		return false;

	for (float x = xBounds.x(); x < xBounds.y()+searchStep; x += searchStep)
	{
		for (float y = yBounds.x(); y < yBounds.y()+searchStep; y += searchStep)
		{
			const float		a	= de::min(x, xBounds.y());
			const float		b	= de::min(y, yBounds.y());
			const Vec4		c0	= quad0.p00*(1.0f-a)*(1.0f-b) + quad0.p10*a*(1.0f-b) + quad0.p01*(1.0f-a)*b + quad0.p11*a*b;
			const Vec4		c1	= quad1.p00*(1.0f-a)*(1.0f-b) + quad1.p10*a*(1.0f-b) + quad1.p01*(1.0f-a)*b + quad1.p11*a*b;

			if (isLinearRangeValid(prec, c0, c1, zBounds, result))
				return true;
		}
	}

	return false;
}